

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

bool RigidBodyDynamics::InverseKinematics
               (Model *model,VectorNd *Qinit,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *body_id,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *body_point,
               vector<Vector3_t,_std::allocator<Vector3_t>_> *target_pos,VectorNd *Qres,
               double step_tol,double lambda,uint max_iter)

{
  Scalar SVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  Scalar *pSVar6;
  CoeffReturnType pdVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Index IVar10;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  long in_RDI;
  vector<Vector3_t,_std::allocator<Vector3_t>_> *in_R8;
  double in_XMM0_Qa;
  RealScalar RVar11;
  double in_XMM1_Qa;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar12;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  PVar13;
  uint in_stack_00000008;
  VectorNd *in_stack_00000078;
  VectorNd *in_stack_00000080;
  VectorNd *in_stack_00000088;
  Model *in_stack_00000090;
  VectorNd test_delta;
  uint i_1;
  VectorNd test_res;
  VectorNd test_1;
  VectorNd delta_theta;
  bool solve_successful;
  VectorNd z;
  undefined1 in_stack_000002cf;
  MatrixNd JJTe_lambda2_I;
  uint row;
  VectorNd *in_stack_000002e8;
  uint j;
  uint i;
  Vector3d point_base;
  MatrixNd G;
  uint k;
  uint ik_iter;
  VectorNd e;
  MatrixNd J;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffc08;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_stack_fffffffffffffc10;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  *in_stack_fffffffffffffc18;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc20;
  TransposeReturnType in_stack_fffffffffffffc30;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  *in_stack_fffffffffffffc38;
  RhsNested in_stack_fffffffffffffc50;
  LhsNested in_stack_fffffffffffffc58;
  undefined4 local_2b4;
  VectorNd *in_stack_fffffffffffffdb0;
  VectorNd *in_stack_fffffffffffffdb8;
  MatrixNd *in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffe1f;
  Vector3d *in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe2c;
  VectorNd *in_stack_fffffffffffffe30;
  Model *in_stack_fffffffffffffe38;
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined1 local_1;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((Index)in_stack_fffffffffffffc18,(Index)in_stack_fffffffffffffc10);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc10,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffffc08);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffc18);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc08);
  PVar12.m_rhs = in_stack_fffffffffffffc50;
  PVar12.m_lhs.m_matrix = in_stack_fffffffffffffc58.m_matrix;
  local_b0 = 0;
  do {
    if (in_stack_00000008 <= local_b0) {
      local_1 = 0;
LAB_00859f21:
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859f2e);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x859f3b);
      return (bool)(local_1 & 1);
    }
    UpdateKinematicsCustom(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
    local_b4 = 0;
    while( true ) {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
      if (sVar5 <= local_b4) break;
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                ((Index)in_stack_fffffffffffffc18,(Index)in_stack_fffffffffffffc10);
      Eigen::Matrix<double,-1,-1,0,-1,-1>::
      Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc20,
                 in_stack_fffffffffffffc18);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,(ulong)local_b4);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[](in_RCX,(ulong)local_b4);
      CalcPointJacobian(_j,in_stack_000002e8,
                        JJTe_lambda2_I.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols._4_4_,
                        (Vector3d *)
                        JJTe_lambda2_I.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_rows,(MatrixNd *)
                               JJTe_lambda2_I.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_data,(bool)in_stack_000002cf);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,(ulong)local_b4);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[](in_RCX,(ulong)local_b4);
      CalcBodyToBaseCoordinates
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f);
      for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
        for (local_108 = 0; local_108 < *(uint *)(in_RDI + 0x50); local_108 = local_108 + 1) {
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08,0x8596ef);
          SVar1 = *pSVar6;
          pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                              in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08,0x85972d);
          *pSVar6 = SVar1;
        }
        std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[](in_R8,(ulong)local_b4);
        pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                            in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        dVar2 = *pdVar7;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        dVar3 = *pSVar8;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           (in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        *pSVar9 = dVar2 - dVar3;
      }
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                ((Matrix<double,__1,__1,_0,__1,__1> *)0x8598a8);
      local_b4 = local_b4 + 1;
    }
    RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffc08);
    if (RVar11 < in_XMM0_Qa) {
      local_1 = 1;
      goto LAB_00859f21;
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc08);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc10,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               in_stack_fffffffffffffc08);
    in_stack_fffffffffffffe20 = (Vector3d *)(in_XMM1_Qa * in_XMM1_Qa);
    Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
              ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc10);
    Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
              ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc10);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
              ((Index)in_stack_fffffffffffffc38,(Index)in_stack_fffffffffffffc30.m_matrix);
    Eigen::operator*((double *)PVar12.m_lhs.m_matrix.m_matrix,(StorageBaseType *)PVar12.m_rhs);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,0>>
    ::operator+(in_stack_fffffffffffffc38,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                 *)in_stack_fffffffffffffc30.m_matrix);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>const>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc10,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                *)in_stack_fffffffffffffc08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
               (unsigned_long *)in_stack_fffffffffffffc18);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc10,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffc08);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc08);
    Math::LinSolveGaussElimPivot
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859a9f);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x859aac)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffc08);
    PVar12 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                        in_stack_fffffffffffffc10,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffc08);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)in_stack_fffffffffffffc08);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc38,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               in_stack_fffffffffffffc30.m_matrix);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffc08);
    RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffc08);
    if (in_XMM0_Qa <= RVar11) {
      Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc10);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
                 (long *)in_stack_fffffffffffffc18);
      Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc10);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc20,
                 (long *)in_stack_fffffffffffffc18);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffc10);
      local_2b4 = 0;
      while( true ) {
        IVar10 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                           ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                            in_stack_fffffffffffffc10);
        if (IVar10 <= (long)(ulong)local_2b4) break;
        in_stack_fffffffffffffc38 =
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        *(Scalar *)in_stack_fffffffffffffc38 = 1.0;
        in_stack_fffffffffffffc30 =
             Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffffc08);
        PVar13 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                           ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)in_stack_fffffffffffffc10,
                            (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                            in_stack_fffffffffffffc08);
        in_stack_fffffffffffffc20 =
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar13.m_rhs;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffc10,
                   (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)in_stack_fffffffffffffc08);
        in_stack_fffffffffffffc18 =
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::squaredNorm
                          (in_stack_fffffffffffffc20);
        in_stack_fffffffffffffc10 =
             (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       (in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        *(CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          **)in_stack_fffffffffffffc10 = in_stack_fffffffffffffc18;
        in_stack_fffffffffffffc08 =
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          (in_stack_fffffffffffffc10,(Index)in_stack_fffffffffffffc08);
        *(Scalar *)in_stack_fffffffffffffc08 = 0.0;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859def)
        ;
        local_2b4 = local_2b4 + 1;
      }
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859e67);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859e74);
      bVar4 = false;
    }
    else {
      local_1 = 1;
      bVar4 = true;
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859e8c);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x859e99);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x859ea6)
    ;
    if (bVar4) goto LAB_00859f21;
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

RBDL_DLLAPI bool InverseKinematics (
    Model &model,
    const VectorNd &Qinit,
    const std::vector<unsigned int>& body_id,
    const std::vector<Vector3d>& body_point,
    const std::vector<Vector3d>& target_pos,
    VectorNd &Qres,
    double step_tol,
    double lambda,
    unsigned int max_iter) {
  assert (Qinit.size() == model.q_size);
  assert (body_id.size() == body_point.size());
  assert (body_id.size() == target_pos.size());

  MatrixNd J = MatrixNd::Zero(3 * body_id.size(), model.qdot_size);
  VectorNd e = VectorNd::Zero(3 * body_id.size());

  Qres = Qinit;

  for (unsigned int ik_iter = 0; ik_iter < max_iter; ik_iter++) {
    UpdateKinematicsCustom (model, &Qres, NULL, NULL);

    for (unsigned int k = 0; k < body_id.size(); k++) {
      MatrixNd G (MatrixNd::Zero(3, model.qdot_size));
      CalcPointJacobian (model, Qres, body_id[k], body_point[k], G, false);
      Vector3d point_base = 
        CalcBodyToBaseCoordinates (model, Qres, body_id[k], body_point[k], false);
      LOG << "current_pos = " << point_base.transpose() << std::endl;

      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < model.qdot_size; j++) {
          unsigned int row = k * 3 + i;
          LOG << "i = " << i << " j = " << j << " k = " << k << " row = " 
            << row << " col = " << j << std::endl;
          J(row, j) = G (i,j);
        }

        e[k * 3 + i] = target_pos[k][i] - point_base[i];
      }
    }

    LOG << "J = " << J << std::endl;
    LOG << "e = " << e.transpose() << std::endl;

    // abort if we are getting "close"
    if (e.norm() < step_tol) {
      LOG << "Reached target close enough after " << ik_iter << " steps" << std::endl;
      return true;
    }

    MatrixNd JJTe_lambda2_I = 
      J * J.transpose() 
      + lambda*lambda * MatrixNd::Identity(e.size(), e.size());

    VectorNd z (body_id.size() * 3);

    bool solve_successful = LinSolveGaussElimPivot (JJTe_lambda2_I, e, z);
    assert (solve_successful);

    LOG << "z = " << z << std::endl;

    VectorNd delta_theta = J.transpose() * z;
    LOG << "change = " << delta_theta << std::endl;

    Qres = Qres + delta_theta;
    LOG << "Qres = " << Qres.transpose() << std::endl;

    if (delta_theta.norm() < step_tol) {
      LOG << "reached convergence after " << ik_iter << " steps" << std::endl;
      return true;
    }

    VectorNd test_1 (z.size());
    VectorNd test_res (z.size());

    test_1.setZero();

    for (unsigned int i = 0; i < z.size(); i++) {
      test_1[i] = 1.;

      VectorNd test_delta = J.transpose() * test_1;

      test_res[i] = test_delta.squaredNorm();

      test_1[i] = 0.;
    }

    LOG << "test_res = " << test_res.transpose() << std::endl;
  }

  return false;
}